

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void visit_eos(void *userdata,ALboolean okay,uint32 ticks)

{
  uint32 ticks_local;
  ALboolean okay_local;
  void *userdata_local;
  
  if (run_calls != 0) {
    wait_until(ticks);
  }
  if (okay == '\0') {
    fprintf(_stderr,"\n<<< UNEXPECTED LOG ENTRY. BUG? NEW LOG VERSION? CORRUPT FILE? >>>\n");
    fflush(_stderr);
  }
  else if (dumping != 0) {
    printf("\n<<< END OF TRACE FILE >>>\n");
    fflush(_stdout);
  }
  return;
}

Assistant:

void visit_eos(void *userdata, const ALboolean okay, const uint32 ticks)
{
    if (run_calls) {
        wait_until(ticks);
    }

    if (!okay) {
        fprintf(stderr, "\n<<< UNEXPECTED LOG ENTRY. BUG? NEW LOG VERSION? CORRUPT FILE? >>>\n");
        fflush(stderr);
    } else if (dumping) {
        printf("\n<<< END OF TRACE FILE >>>\n");
        fflush(stdout);
    }
}